

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::getIntegerv(ReferenceContext *this,deUint32 pname,int *param)

{
  int iVar1;
  
  if ((int)pname < 0x851c) {
    if (pname == 0xd33) {
      iVar1 = (this->m_limits).maxTexture2DSize;
    }
    else if (pname == 0x8073) {
      iVar1 = (this->m_limits).maxTexture3DSize;
    }
    else {
      if (pname != 0x84e8) goto LAB_018e80ee;
      iVar1 = (this->m_limits).maxRenderbufferSize;
    }
  }
  else if ((int)pname < 0x8872) {
    if (pname == 0x851c) {
      iVar1 = (this->m_limits).maxTextureCubeSize;
    }
    else {
      if (pname != 0x8869) {
LAB_018e80ee:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      iVar1 = (this->m_limits).maxVertexAttribs;
    }
  }
  else if (pname == 0x8872) {
    iVar1 = (this->m_limits).maxTextureImageUnits;
  }
  else {
    if (pname != 0x88ff) goto LAB_018e80ee;
    iVar1 = (this->m_limits).maxTexture2DArrayLayers;
  }
  *param = iVar1;
  return;
}

Assistant:

void ReferenceContext::getIntegerv (deUint32 pname, int* param)
{
	switch (pname)
	{
		case GL_MAX_TEXTURE_SIZE:			*param = m_limits.maxTexture2DSize;			break;
		case GL_MAX_CUBE_MAP_TEXTURE_SIZE:	*param = m_limits.maxTextureCubeSize;		break;
		case GL_MAX_ARRAY_TEXTURE_LAYERS:	*param = m_limits.maxTexture2DArrayLayers;	break;
		case GL_MAX_3D_TEXTURE_SIZE:		*param = m_limits.maxTexture3DSize;			break;
		case GL_MAX_RENDERBUFFER_SIZE:		*param = m_limits.maxRenderbufferSize;		break;
		case GL_MAX_TEXTURE_IMAGE_UNITS:	*param = m_limits.maxTextureImageUnits;		break;
		case GL_MAX_VERTEX_ATTRIBS:			*param = m_limits.maxVertexAttribs;			break;

		default:
			setError(GL_INVALID_ENUM);
			break;
	}
}